

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_f(void *msp,void *ptr,size_t osize,size_t nsize)

{
  size_t nsize_local;
  size_t osize_local;
  void *ptr_local;
  void *msp_local;
  
  if (nsize == 0) {
    msp_local = lj_alloc_free(msp,ptr);
  }
  else if (ptr == (void *)0x0) {
    msp_local = lj_alloc_malloc(msp,nsize);
  }
  else {
    msp_local = lj_alloc_realloc(msp,ptr,nsize);
  }
  return msp_local;
}

Assistant:

void *lj_alloc_f(void *msp, void *ptr, size_t osize, size_t nsize)
{
  (void)osize;
  if (nsize == 0) {
    return lj_alloc_free(msp, ptr);
  } else if (ptr == NULL) {
    return lj_alloc_malloc(msp, nsize);
  } else {
    return lj_alloc_realloc(msp, ptr, nsize);
  }
}